

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_assignment(dmr_C *C,expression *expr)

{
  expression **rp;
  uint op;
  symbol *type;
  symbol *psVar1;
  int iVar2;
  symbol *sym;
  symbol *psVar3;
  symbol *psVar4;
  expression *peVar5;
  char *pcVar6;
  char *pcVar7;
  expression *peVar8;
  uint lclass;
  uint rclass;
  bool bVar9;
  
  peVar8 = (expr->field_5).field_3.unop;
  if ((*(char *)peVar8 != '\t') || (peVar8->op != 0x2a)) {
    pcVar7 = "not an lvalue";
    goto LAB_0010c0af;
  }
  type = peVar8->ctype;
  rp = &(expr->field_5).field_6.right;
  if (expr->op == 0x3d) {
    iVar2 = compatible_assignment_types(C,expr,type,rp,"assignment");
    if (iVar2 == 0) {
      return (symbol *)0x0;
    }
    goto LAB_0010c461;
  }
  sym = type;
  if (*(char *)type == '\x03') {
    sym = *(symbol **)((long)&type->field_14 + 0x38);
  }
  psVar4 = (*rp)->ctype;
  if (*(char *)sym == '\v') {
    sym = dmrC_evaluate_expression(C,(sym->field_14).field_2.initializer);
    if (sym == (symbol *)0x0) {
      sym = &C->S->bad_ctype;
    }
    else if (*(char *)sym == '\x03') {
      sym = *(symbol **)((long)&sym->field_14 + 0x38);
    }
  }
  if (*(char *)sym == '\t') {
    sym = *(symbol **)((long)&sym->field_14 + 0x38);
  }
  if ((ulong)*(byte *)sym == 2) {
    psVar3 = (sym->field_14).field_2.ctype.base_type;
    if (psVar3 == &C->S->int_type) {
      lclass = 1;
    }
    else {
      if (psVar3 != &C->S->fp_type) goto LAB_0010c15b;
      lclass = 9;
    }
  }
  else {
LAB_0010c15b:
    lclass = classify_type::type_class[*(byte *)sym];
  }
  psVar3 = psVar4;
  if (*(char *)psVar4 == '\x03') {
    psVar3 = *(symbol **)((long)&psVar4->field_14 + 0x38);
  }
  if (*(char *)psVar3 == '\v') {
    psVar3 = dmrC_evaluate_expression(C,(psVar3->field_14).field_2.initializer);
    if (psVar3 == (symbol *)0x0) {
      psVar3 = &C->S->bad_ctype;
    }
    else if (*(char *)psVar3 == '\x03') {
      psVar3 = *(symbol **)((long)&psVar3->field_14 + 0x38);
    }
  }
  if (*(char *)psVar3 == '\t') {
    psVar3 = *(symbol **)((long)&psVar3->field_14 + 0x38);
  }
  if ((ulong)*(byte *)psVar3 == 2) {
    psVar1 = (psVar3->field_14).field_2.ctype.base_type;
    if (psVar1 == &C->S->int_type) {
      rclass = 1;
    }
    else {
      if (psVar1 != &C->S->fp_type) goto LAB_0010c209;
      rclass = 9;
    }
  }
  else {
LAB_0010c209:
    rclass = classify_type::type_class[*(byte *)psVar3];
  }
  op = expr->op;
  if ((lclass & rclass & 1) == 0) {
    if ((lclass == 0x10) && ((rclass & 9) == 1)) {
      if ((op & 0xfffffffd) == 0x100) {
        if ((rclass & 4) != 0) {
          peVar5 = *rp;
          if ((rclass & 0x40) != 0) {
            psVar3 = (psVar3->field_14).field_2.ctype.base_type;
          }
          pcVar7 = dmrC_show_typename(C,psVar3);
          dmrC_warning(C,peVar5->pos,"%s degrades to integer",pcVar7);
          psVar3 = (psVar3->field_14).field_2.ctype.base_type;
        }
        evaluate_ptr_add(C,expr,psVar3);
        goto LAB_0010c461;
      }
      pcVar7 = "invalid pointer assignment";
      goto LAB_0010c0af;
    }
  }
  else if (((lclass & 8) == 0) || ((op - 0x100 < 7 && ((0x65U >> (op - 0x100 & 0x1f) & 1) != 0)))) {
    if ((lclass & 4) == 0) {
      if ((rclass & 4) != 0) {
        if (sym == psVar3) goto LAB_0010c461;
LAB_0010c3de:
        pcVar7 = dmrC_show_special(C,op);
        dmrC_warning(C,expr->pos,"invalid assignment: %s",pcVar7);
        pcVar7 = dmrC_show_typename(C,sym);
        dmrC_info(C,expr->pos,"   left side has type %s",pcVar7);
        pcVar7 = dmrC_show_typename(C,psVar3);
        dmrC_info(C,expr->pos,"   right side has type %s",pcVar7);
LAB_0010c447:
        peVar8 = cast_to(C,(expr->field_5).field_6.right,type);
        (expr->field_5).field_6.right = peVar8;
        return (symbol *)0x0;
      }
      psVar4 = usual_conversions(C,op,(expr->field_5).field_3.unop,(expr->field_5).field_6.right,
                                 lclass,rclass,type,psVar4);
    }
    else {
      iVar2 = restricted_binop(op);
      if (iVar2 == 0) {
        pcVar7 = dmrC_show_special(C,op);
        pcVar6 = dmrC_show_typename(C,sym);
        dmrC_warning(C,expr->pos,"bad assignment (%s) to %s",pcVar7,pcVar6);
        goto LAB_0010c447;
      }
      if (((rclass & 0x40) == 0) ||
         (psVar4 = type, (psVar3->field_14).field_2.ctype.base_type != sym)) {
        if (*(char *)*rp == '\x01') {
          bVar9 = ((*rp)->field_5).field_0.value == 0;
        }
        else {
          bVar9 = false;
        }
        if ((sym == psVar3) || (bVar9)) goto LAB_0010c461;
        goto LAB_0010c3de;
      }
    }
    peVar5 = cast_to(C,*rp,psVar4);
    *rp = peVar5;
LAB_0010c461:
    evaluate_assign_to(C,peVar8,type);
    expr->ctype = type;
    return type;
  }
  pcVar7 = "invalid assignment";
LAB_0010c0af:
  dmrC_expression_error(C,expr,pcVar7);
  return (symbol *)0x0;
}

Assistant:

static struct symbol *evaluate_assignment(struct dmr_C *C, struct expression *expr)
{
	struct expression *left = expr->left;
	struct expression *where = expr;
	struct symbol *ltype;

	if (!lvalue_expression(C, left)) {
		dmrC_expression_error(C, expr, "not an lvalue");
		return NULL;
	}

	ltype = left->ctype;

	if (expr->op != '=') {
		if (!evaluate_assign_op(C, expr))
			return NULL;
	} else {
		if (!compatible_assignment_types(C, where, ltype, &expr->right, "assignment"))
			return NULL;
	}

	evaluate_assign_to(C, left, ltype);

	expr->ctype = ltype;
	return ltype;
}